

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-writer.cc
# Opt level: O2

void __thiscall
wabt::anon_unknown_1::WatWriter::WriteTypes(WatWriter *this,TypeVector *types,char *name)

{
  NextChar next_char;
  NextChar extraout_EDX;
  NextChar extraout_EDX_00;
  Type *pTVar1;
  Type *pTVar2;
  
  next_char = (NextChar)name;
  pTVar1 = (types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pTVar2 = (types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (pTVar2 != pTVar1) {
    if (name != (char *)0x0) {
      WriteOpenSpace(this,name);
      pTVar1 = (types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pTVar2 = (types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      next_char = extraout_EDX;
    }
    for (; pTVar1 != pTVar2; pTVar1 = pTVar1 + 1) {
      WriteType(this,*pTVar1,next_char);
      next_char = extraout_EDX_00;
    }
    if (name != (char *)0x0) {
      WriteCloseSpace(this);
      return;
    }
  }
  return;
}

Assistant:

void WatWriter::WriteTypes(const TypeVector& types, const char* name) {
  if (types.size()) {
    if (name) {
      WriteOpenSpace(name);
    }
    for (Type type : types) {
      WriteType(type, NextChar::Space);
    }
    if (name) {
      WriteCloseSpace();
    }
  }
}